

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O1

void easm_del_operand(easm_operand *operand)

{
  long lVar1;
  
  if (operand != (easm_operand *)0x0) {
    easm_del_mods(operand->mods);
    if (0 < operand->exprsnum) {
      lVar1 = 0;
      do {
        easm_del_expr(operand->exprs[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < operand->exprsnum);
    }
    free(operand->exprs);
    free(operand);
    return;
  }
  return;
}

Assistant:

void easm_del_operand(struct easm_operand *operand) {
	if (!operand) return;
	easm_del_mods(operand->mods);
	int i;
	for (i = 0; i < operand->exprsnum; i++)
		easm_del_expr(operand->exprs[i]);
	free(operand->exprs);
	free(operand);
}